

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O2

UINT32 __thiscall TreeModel::base(TreeModel *this,UModelIndex *current)

{
  bool bVar1;
  UINT32 UVar2;
  UINT32 UVar3;
  UModelIndex *this_00;
  UModelIndex parent;
  UModelIndex local_48;
  
  this_00 = &local_48;
  bVar1 = UModelIndex::isValid(current);
  UVar2 = 0;
  if (bVar1) {
    UModelIndex::parent(&local_48,current);
    UVar2 = offset((TreeModel *)this_00,current);
    if (((-1 < local_48.r) && (-1 < local_48.c)) && (local_48.m != (TreeModel *)0x0)) {
      UVar3 = base(this,&local_48);
      UVar2 = UVar2 + UVar3;
    }
  }
  return UVar2;
}

Assistant:

UINT32 TreeModel::base(const UModelIndex &current) const
{
    // Rewrite this as loop if we ever see an image that is too deep for this naive implementation
    if (!current.isValid())
        return 0;
    
    UModelIndex parent = current.parent();
    if (!parent.isValid())
        return offset(current);
    else {
        return offset(current) + base(parent);
    }
}